

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedDepthStencil
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  ostream *poVar5;
  int widthCommitted;
  GLint height;
  GLint width;
  GLint depth;
  string fragmentSource;
  string vertexSource;
  ShaderProgram program;
  ProgramSources local_100;
  
  bVar2 = true;
  if (format == 0x8058 && target == 0xde1) {
    puVar1 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              field_0x88;
    std::operator<<((ostream *)puVar1,"Depth Stencil - ");
    SparseTextureUtils::getTextureLevelSize
              (0xde1,&(this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
    widthCommitted = width / 2;
    bVar2 = true;
    if (((2 < width + 1U) && (height != 0)) &&
       ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth <= depth)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vertexSource,st2_vertex_drawBuffer,(allocator<char> *)&program);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fragmentSource,st2_fragment_drawBuffer,(allocator<char> *)&program);
      glu::makeVtxFragSources(&local_100,&vertexSource,&fragmentSource);
      glu::ShaderProgram::ShaderProgram(&program,gl,&local_100);
      glu::ProgramSources::~ProgramSources(&local_100);
      if (program.m_program.m_info.linkOk == false) {
        poVar5 = std::operator<<((ostream *)puVar1,
                                 "Shader compilation failed (depth_stencil) for target: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xde1);
        poVar5 = std::operator<<(poVar5,", format: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8058);
        poVar5 = std::operator<<(poVar5,", vertex_infoLog: ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &((*program.m_shaders[0].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog);
        poVar5 = std::operator<<(poVar5,", fragment_infoLog: ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        &((*program.m_shaders[1].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog);
        poVar5 = std::operator<<(poVar5,", vertexSource: ");
        poVar5 = std::operator<<(poVar5,vertexSource._M_dataplus._M_p);
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,", fragmentSource: ");
        poVar5 = std::operator<<(poVar5,fragmentSource._M_dataplus._M_p);
        std::operator<<(poVar5," - ");
        bVar2 = false;
      }
      else {
        prepareDepthStencilFramebuffer(this,gl,width,height);
        (*gl->useProgram)(program.m_program.m_program);
        (*gl->activeTexture)(0x84c0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x621);
        gl4cts::Texture::Bind(gl,*texture,0xde1);
        (*gl->uniform1i)(1,0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x624);
        bVar2 = verifyStencilTest(this,gl,&program,width,height,widthCommitted);
        if (bVar2) {
          bVar2 = verifyDepthTest(this,gl,&program,width,height,widthCommitted);
        }
        else {
          bVar2 = false;
        }
        bVar3 = glu::ContextInfo::isExtensionSupported
                          (((this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                           m_contextInfo,"GL_EXT_depth_bounds_test");
        if ((bVar2 & bVar3) == 1) {
          bVar2 = verifyDepthBoundsTest(this,gl,&program,width,height,widthCommitted);
        }
        else {
          bVar2 = (bool)(bVar2 & !bVar3);
        }
        cleanupDepthStencilFramebuffer(this,gl);
      }
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::string::~string((string *)&fragmentSource);
      std::__cxx11::string::~string((string *)&vertexSource);
    }
  }
  return bVar2;
}

Assistant:

bool UncommittedRegionsAccessTestCase::depthStencilAllowed(GLint target, GLint format)
{
	if (target == GL_TEXTURE_2D && format == GL_RGBA8)
	{
		return true;
	}

	return false;
}